

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

void Zero24(void *destinationBuffer,int destinationStride,uint count)

{
  uchar *dest;
  undefined1 *puVar1;
  
  if (count != 0) {
    puVar1 = (undefined1 *)((long)destinationBuffer + 2);
    do {
      *(undefined2 *)(puVar1 + -2) = 0;
      *puVar1 = 0;
      puVar1 = puVar1 + destinationStride * 3;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Zero24( void *destinationBuffer, signed int destinationStride,
        unsigned int count )
{
    unsigned char *dest = (unsigned char*)destinationBuffer;

    while( count-- )
    {
        dest[0] = 0;
        dest[1] = 0;
        dest[2] = 0;

        dest += destinationStride * 3;
    }
}